

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadRefType(BinaryReader *this,Type *out_value,char *desc)

{
  uint in_EAX;
  Result RVar1;
  ulong uStack_28;
  uint32_t type;
  
  uStack_28 = (ulong)in_EAX;
  RVar1 = ReadS32Leb128(this,&type,desc);
  if (RVar1.enum_ != Error) {
    out_value->enum_ = type;
    if ((type + 0x18 < 9) && ((0x181U >> (type + 0x18 & 0x1f) & 1) != 0)) {
      return (Result)Ok;
    }
    PrintError(this,"%s must be a reference type",desc);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadRefType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  *out_value = static_cast<Type>(type);
  ERROR_UNLESS(out_value->IsRef(), "%s must be a reference type", desc);
  return Result::Ok;
}